

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.hpp
# Opt level: O2

string * __thiscall
Kandinsky::Constant::toString_abi_cxx11_(string *__return_storage_ptr__,Constant *this,bool param_1)

{
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
  ::operator()(__return_storage_ptr__,&this->m_formatter,this->m_value);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString(bool /*evaluate*/ = false) const
        {
            return m_formatter(m_value);
        }